

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O0

slReturn ubxSynchronizer(int fdPort,int maxTimeMs,int verbosity)

{
  ubxMsg pollMsg;
  errInfo error;
  undefined8 uVar1;
  _Bool _Var2;
  longlong lVar3;
  slReturn pvVar4;
  longlong lVar5;
  slBuffer *body_00;
  slReturn result;
  ubxMsg ans;
  ubxMsg msg;
  slBuffer *body;
  undefined1 auStack_50 [6];
  ubxType type;
  char *local_48;
  char *local_40;
  undefined8 local_38;
  slReturn frResp;
  longlong start;
  int verbosity_local;
  int maxTimeMs_local;
  int fdPort_local;
  
  lVar3 = currentTimeMs();
  pvVar4 = flushRx(fdPort);
  _Var2 = isErrorReturn(pvVar4);
  if (_Var2) {
    createErrorInfo((errorInfo_slReturn *)auStack_50,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c",
                    "ubxSynchronizer",0x491,pvVar4);
    error.fileName = local_48;
    error.cause = _auStack_50;
    error.functionName = local_40;
    error._24_8_ = local_38;
    makeErrorMsgReturn(error,"could not flush receiver prior to synchronization");
  }
  do {
    lVar5 = currentTimeMs();
    if (lVar3 + maxTimeMs <= lVar5) {
      pvVar4 = makeOkInfoReturn((void *)0x0);
      return pvVar4;
    }
    body_00 = create_slBuffer(0,LittleEndian);
    createUbxMsg((ubxMsg *)&ans.checksum,(ubxType)0x40a,body_00);
    uVar1 = ans._16_8_;
    pollMsg.body = (slBuffer *)msg._0_8_;
    pollMsg.type.class = ans.checksum.ck_a;
    pollMsg.type.id = ans.checksum.ck_b;
    pollMsg._2_6_ = ans._18_6_;
    pollMsg._16_8_ = msg.body;
    ans._16_8_ = uVar1;
    pvVar4 = pollUbx(fdPort,pollMsg,0x4b0,(ubxMsg *)&result);
    _Var2 = isOkReturn(pvVar4);
  } while (!_Var2);
  pvVar4 = makeOkInfoReturn((void *)0x1);
  return pvVar4;
}

Assistant:

extern slReturn ubxSynchronizer(int fdPort, int maxTimeMs, int verbosity) {

    long long start = currentTimeMs();

    // flush any junk we might have in the receiver buffer...
    slReturn frResp = flushRx(fdPort);
    if (isErrorReturn(frResp))
        makeErrorMsgReturn(ERR_CAUSE(frResp), "could not flush receiver prior to synchronization");

    // read characters until either we appear to be synchronized or we run out of time...
    while (currentTimeMs() < start + maxTimeMs) {

        // send the request message and wait for the response...
        ubxType type = {UBX_MON, UBX_MON_VER};
        slBuffer *body = create_slBuffer(0, LittleEndian);
        ubxMsg msg = createUbxMsg(type, body);
        ubxMsg ans;
        slReturn result = pollUbx(fdPort, msg, MON_VER_SYNC_MAX_MS, &ans);
        if (isOkReturn(result))
            return makeOkInfoReturn(bool2info(true));
    }
    return makeOkInfoReturn(bool2info(false));
}